

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Close(PortMidiStream *stream)

{
  PmError local_1c;
  PmError err;
  PmInternal *midi;
  PortMidiStream *stream_local;
  
  local_1c = pmNoData;
  pm_hosterror = 0;
  if (stream == (PortMidiStream *)0x0) {
    local_1c = pmBadPtr;
  }
  else if ((*stream < 0) || (pm_descriptor_index <= *stream)) {
    local_1c = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_1c = pmBadPtr;
  }
  if (local_1c == pmNoData) {
    local_1c = (**(code **)(*(long *)((long)stream + 0x50) + 0x48))(stream);
    descriptors[*stream].internalDescriptor = (void *)0x0;
    descriptors[*stream].pub.opened = 0;
    if (*(long *)((long)stream + 0x20) != 0) {
      Pm_QueueDestroy(*(PmQueue **)((long)stream + 0x20));
    }
    pm_free(stream);
  }
  return local_1c;
}

Assistant:

PMEXPORT PmError Pm_Close( PortMidiStream *stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    pm_hosterror = FALSE;
    /* arg checking */
    if (midi == NULL) /* midi must point to something */
        err = pmBadPtr;
    /* if it is an open device, the device_id will be valid */
    else if (midi->device_id < 0 || midi->device_id >= pm_descriptor_index)
        err = pmBadPtr;
    /* and the device should be in the opened state */
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    
    if (err != pmNoError) 
        goto error_return;

    /* close the device */
    err = (*midi->dictionary->close)(midi);
    /* even if an error occurred, continue with cleanup */
    descriptors[midi->device_id].internalDescriptor = NULL;
    descriptors[midi->device_id].pub.opened = FALSE;
    if (midi->queue) Pm_QueueDestroy(midi->queue);
    pm_free(midi); 
error_return:
    /* system dependent code must set pm_hosterror and
     * pm_hosterror_text if a pmHostError occurs.
     */
    return pm_errmsg(err);
}